

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

int ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                 void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                 float scale_max,ImVec2 frame_size)

{
  ImVec2 IVar1;
  ImGuiWindow *this;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  ImRect IVar6;
  bool bVar7;
  ImGuiID id;
  ImU32 IVar8;
  ImGuiContext *g;
  int iVar9;
  undefined4 in_register_0000008c;
  int iVar10;
  char *text;
  int iVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 in_XMM0_Dd;
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var [60];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar18;
  undefined8 in_XMM2_Qb;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  ImVec2 pos1;
  ImVec2 pos0;
  ImRect frame_bb;
  ImRect total_bb;
  undefined8 local_168;
  ImVec2 local_160;
  undefined1 local_158 [16];
  ImGuiContext *local_148;
  ImU32 local_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  char *local_118;
  ImVec2 local_110;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  ImRect local_c8;
  undefined1 local_b8 [16];
  ImGuiWindow *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImRect local_40;
  
  local_f8._8_8_ = local_f8._0_8_;
  local_148 = GImGui;
  local_f8._4_4_ = in_register_0000008c;
  local_f8._0_4_ = values_offset;
  local_b8._4_4_ = in_XMM0_Db;
  local_b8._0_4_ = scale_min;
  local_b8._8_4_ = in_XMM0_Dc;
  local_b8._12_4_ = in_XMM0_Dd;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return -1;
  }
  local_d8._4_4_ = in_XMM1_Db;
  local_d8._0_4_ = scale_max;
  local_d8._8_4_ = in_XMM1_Dc;
  local_d8._12_4_ = in_XMM1_Dd;
  local_138._8_8_ = in_XMM2_Qb;
  local_138._0_8_ = frame_size;
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  auVar19._0_8_ = CalcTextSize(label,(char *)0x0,true,-1.0);
  auVar19._8_56_ = extraout_var_00;
  local_88 = auVar19._0_16_;
  if ((local_138._0_4_ == 0.0) && (!NAN(local_138._0_4_))) {
    fVar13 = CalcItemWidth();
    local_138._4_12_ = local_138._4_12_;
    local_138._0_4_ = fVar13;
  }
  auVar15 = vmovshdup_avx(local_138);
  if ((auVar15._0_4_ == 0.0) && (!NAN(auVar15._0_4_))) {
    auVar15 = vmovshdup_avx(local_88);
    auVar15 = vfmadd132ss_fma(ZEXT416((uint)(local_148->Style).FramePadding.y),auVar15,
                              ZEXT416(0x40000000));
    local_138 = vinsertps_avx(local_138,auVar15,0x10);
  }
  IVar1 = (this->DC).CursorPos;
  register0x00001208 = 0;
  local_108._0_4_ = IVar1.x;
  local_108._4_4_ = IVar1.y;
  local_98._0_4_ = local_138._0_4_ + IVar1.x;
  local_98._4_4_ = local_138._4_4_ + IVar1.y;
  local_98._8_4_ = local_138._8_4_ + 0.0;
  local_98._12_4_ = local_138._12_4_ + 0.0;
  local_c8 = (ImRect)vmovlhps_avx(_local_108,local_98);
  fVar13 = 0.0;
  if (0.0 < local_88._0_4_) {
    fVar13 = local_88._0_4_ + (local_148->Style).ItemInnerSpacing.x;
  }
  IVar1 = (local_148->Style).FramePadding;
  local_e8 = IVar1.x;
  fStack_e4 = IVar1.y;
  fStack_e0 = 0.0;
  fStack_dc = 0.0;
  auVar15._0_4_ = (float)local_98._0_4_ + fVar13;
  auVar15._4_4_ = local_98._4_4_ + 0.0;
  auVar15._8_4_ = local_98._8_4_ + 0.0;
  auVar15._12_4_ = local_98._12_4_ + 0.0;
  local_40.Min = local_c8.Min;
  local_40.Max = (ImVec2)vmovlps_avx(auVar15);
  local_118 = label;
  local_a0 = this;
  ItemSize(&local_40,(local_148->Style).FramePadding.y);
  bVar7 = ItemAdd(&local_40,0,&local_c8,0);
  if (!bVar7) {
    return -1;
  }
  bVar7 = ItemHoverable(&local_c8,id);
  text = local_118;
  if ((((float)local_b8._0_4_ == 3.4028235e+38) && (!NAN((float)local_b8._0_4_))) ||
     (((float)local_d8._0_4_ == 3.4028235e+38 && (!NAN((float)local_d8._0_4_))))) {
    iVar10 = 0x7f7fffff;
    if (values_count < 1) {
      iVar9 = -0x800001;
    }
    else {
      iVar11 = 0;
      auVar20 = ZEXT464(0xff7fffff);
      auVar19 = ZEXT464(0x7f7fffff);
      do {
        local_128 = auVar20._0_16_;
        local_158 = auVar19._0_16_;
        auVar20._0_4_ = (*values_getter)(data,iVar11);
        auVar20._4_60_ = extraout_var;
        bVar5 = NAN(auVar20._0_4_);
        uVar2 = vcmpss_avx512f(auVar20._0_16_,local_128,2);
        bVar4 = (bool)((byte)uVar2 & 1);
        auVar15 = vminss_avx(local_158,auVar20._0_16_);
        iVar9 = (uint)bVar5 * local_128._0_4_ +
                (uint)!bVar5 * ((uint)bVar4 * local_128._0_4_ + (uint)!bVar4 * (int)auVar20._0_4_);
        iVar10 = (uint)bVar5 * local_158._0_4_ + (uint)!bVar5 * auVar15._0_4_;
        iVar11 = iVar11 + 1;
        auVar19 = ZEXT1664(CONCAT124(auVar15._4_12_,iVar10));
        auVar20 = ZEXT1664(CONCAT124(extraout_var._0_12_,iVar9));
      } while (values_count != iVar11);
    }
    uVar2 = vcmpss_avx512f(local_b8,SUB6416(ZEXT464(0x7f7fffff),0),0);
    bVar5 = (bool)((byte)uVar2 & 1);
    local_b8._0_4_ = (uint)bVar5 * iVar10 + (uint)!bVar5 * local_b8._0_4_;
    uVar2 = vcmpss_avx512f(local_d8,SUB6416(ZEXT464(0x7f7fffff),0),0);
    bVar5 = (bool)((byte)uVar2 & 1);
    local_d8._0_4_ = (uint)bVar5 * iVar9 + (uint)!bVar5 * local_d8._0_4_;
  }
  IVar6 = local_c8;
  local_108._4_4_ = (float)local_108._4_4_ + fStack_e4;
  local_108._0_4_ = (float)local_108._0_4_ + local_e8;
  fStack_100 = fStack_100 + fStack_e0;
  fStack_fc = fStack_fc + fStack_dc;
  local_158._8_8_ = 0;
  local_158._0_4_ = local_c8.Min.x;
  local_158._4_4_ = local_c8.Min.y;
  local_c8.Max = IVar6.Max;
  local_128._8_8_ = 0;
  local_128._0_4_ = local_c8.Max.x;
  local_128._4_4_ = local_c8.Max.y;
  local_c8 = IVar6;
  IVar8 = GetColorU32(7,1.0);
  RenderFrame((ImVec2)local_158._0_8_,(ImVec2)local_128._0_8_,IVar8,true,
              (local_148->Style).FrameRounding);
  local_168._0_4_ = -1;
  if (values_count < (int)((plot_type == ImGuiPlotType_Lines) + 1)) goto LAB_002fb6fa;
  auVar12._4_4_ = fStack_e4;
  auVar12._0_4_ = local_e8;
  auVar12._8_4_ = fStack_e0;
  auVar12._12_4_ = fStack_dc;
  local_128 = vsubps_avx(local_98,auVar12);
  iVar10 = (int)(float)local_138._0_4_;
  if (values_count <= (int)(float)local_138._0_4_) {
    iVar10 = values_count;
  }
  iVar10 = iVar10 - (uint)(plot_type == ImGuiPlotType_Lines);
  iVar9 = values_count - (uint)(plot_type == ImGuiPlotType_Lines);
  local_158._0_4_ = iVar9;
  local_168 = 0xffffffff;
  local_168._0_4_ = -1;
  if (bVar7) {
    fVar13 = (local_148->IO).MousePos.x;
    fVar14 = local_108._0_4_;
    if (fVar14 <= fVar13) {
      fVar18 = (local_148->IO).MousePos.y;
      auVar15 = vmovshdup_avx(_local_108);
      if (((auVar15._0_4_ <= fVar18) && (fVar13 < local_128._0_4_)) &&
         (auVar15 = vmovshdup_avx(local_128), fVar18 < auVar15._0_4_)) {
        auVar16._0_4_ = (fVar13 - fVar14) / (local_128._0_4_ - fVar14);
        auVar16._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f7ff972),0),auVar16);
        uVar2 = vcmpss_avx512f(auVar16,ZEXT816(0) << 0x20,1);
        iVar11 = (int)((float)((uint)!(bool)((byte)uVar2 & 1) * auVar15._0_4_) * (float)iVar9);
        local_168 = CONCAT44((int)((ulong)overlay_text >> 0x20),iVar11);
        iVar9 = local_f8._0_4_;
        fVar13 = (*values_getter)(data,(iVar11 + iVar9) % values_count);
        local_138._0_4_ = fVar13;
        fVar13 = (*values_getter)(data,(iVar11 + 1 + iVar9) % values_count);
        if (plot_type == ImGuiPlotType_Lines) {
          SetTooltip("%d: %8.4g\n%d: %8.4g",(double)(float)local_138._0_4_,(double)fVar13,iVar11,
                     (ulong)(iVar11 + 1));
        }
        else if (plot_type == ImGuiPlotType_Histogram) {
          SetTooltip("%d: %8.4g",(double)(float)local_138._0_4_,local_168);
        }
        goto LAB_002fb3e2;
      }
    }
  }
  else {
LAB_002fb3e2:
  }
  bVar7 = plot_type != ImGuiPlotType_Lines;
  iVar9 = (int)local_f8._0_8_;
  local_e8 = (*values_getter)(data,(int)((long)((ulong)(uint)(iVar9 >> 0x1f) << 0x20 |
                                               local_f8._0_8_ & 0xffffffff) % (long)values_count));
  IVar8 = GetColorU32(bVar7 + 0x26 + (uint)bVar7,1.0);
  local_98._0_4_ = IVar8;
  local_13c = GetColorU32(bVar7 + 0x27 + (uint)bVar7,1.0);
  text = local_118;
  if (0 < iVar10) {
    local_138._0_4_ = 1.0 / (float)iVar10;
    fVar14 = local_d8._0_4_;
    fVar18 = local_b8._0_4_;
    uVar2 = vcmpss_avx512f(local_b8,local_d8,0);
    auVar17 = ZEXT816(0) << 0x40;
    fVar13 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)(1.0 / (fVar14 - fVar18)));
    local_d8 = ZEXT416((uint)fVar13);
    auVar12 = vfmadd213ss_fma(local_d8,local_b8,SUB6416(ZEXT464(0x3f800000),0));
    uVar2 = vcmpss_avx512f(local_b8,auVar17,1);
    uVar3 = vcmpss_avx512f(ZEXT416((uint)(fVar14 * fVar18)),auVar17,1);
    bVar7 = (bool)((byte)uVar3 & 1);
    auVar16 = ZEXT416((uint)(fVar13 * (local_e8 - fVar18)));
    auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar16);
    uVar3 = vcmpss_avx512f(auVar16,auVar17,1);
    bVar5 = (bool)((byte)uVar3 & 1);
    local_e8 = (float)(int)local_158._0_4_;
    local_f8 = vsubps_avx(local_128,_local_108);
    local_68 = vmovshdup_avx(local_f8);
    local_78 = vmovshdup_avx(_local_108);
    local_58 = vfmadd213ss_fma(ZEXT416((uint)bVar7 * auVar12._0_4_ +
                                       (uint)!bVar7 * (uint)!(bool)((byte)uVar2 & 1) * 0x3f800000),
                               local_68,local_78);
    auVar15 = vinsertps_avx(local_78,ZEXT416((uint)bVar5 * 0x3f800000 +
                                             (uint)!bVar5 * (int)(1.0 - auVar15._0_4_)),0x1d);
    do {
      auVar12 = vfmadd213ss_fma(ZEXT416((uint)local_e8),auVar15,ZEXT416(0x3f000000));
      iVar11 = (int)auVar12._0_4_;
      local_158 = auVar15;
      fVar14 = (*values_getter)(data,(iVar9 + 1 + iVar11) % values_count);
      fVar13 = local_158._0_4_ + (float)local_138._0_4_;
      auVar12 = ZEXT416((uint)((fVar14 - (float)local_b8._0_4_) * (float)local_d8._0_4_));
      auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar12);
      uVar2 = vcmpss_avx512f(auVar12,ZEXT416(0),1);
      bVar7 = (bool)((byte)uVar2 & 1);
      auVar12 = ZEXT416((uint)bVar7 * 0x3f800000 + (uint)!bVar7 * (int)(1.0 - auVar15._0_4_));
      auVar15 = vfmadd213ps_fma(local_158,local_f8,_local_108);
      local_110 = (ImVec2)vmovlps_avx(auVar15);
      auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar13),local_f8,_local_108);
      if (plot_type == ImGuiPlotType_Lines) {
        auVar16 = vfmadd132ss_fma(auVar12,local_78,ZEXT416((uint)local_68._0_4_));
        auVar15 = vinsertps_avx(auVar15,auVar16,0x10);
        local_160 = (ImVec2)vmovlps_avx(auVar15);
        IVar8 = local_98._0_4_;
        if ((int)local_168 == iVar11) {
          IVar8 = local_13c;
        }
        local_158 = ZEXT416((uint)fVar13);
        local_128 = auVar12;
        ImDrawList::AddLine(local_a0->DrawList,&local_110,&local_160,IVar8,1.0);
        auVar15 = local_158;
        auVar12 = local_128;
      }
      else {
        auVar15 = vinsertps_avx(auVar15,ZEXT416((uint)local_58._0_4_),0x10);
        local_160 = (ImVec2)vmovlps_avx(auVar15);
        auVar15 = ZEXT416((uint)fVar13);
        if (plot_type == ImGuiPlotType_Histogram) {
          local_158 = ZEXT416((uint)fVar13);
          if (local_110.x + 2.0 <= local_160.x) {
            local_160.x = local_160.x + -1.0;
          }
          IVar8 = local_98._0_4_;
          if ((int)local_168 == iVar11) {
            IVar8 = local_13c;
          }
          local_128 = auVar12;
          ImDrawList::AddRectFilled(local_a0->DrawList,&local_110,&local_160,IVar8,0.0,0);
          auVar15 = local_158;
          auVar12 = local_128;
        }
      }
      auVar15 = vinsertps_avx(auVar15,auVar12,0x10);
      iVar10 = iVar10 + -1;
      text = local_118;
    } while (iVar10 != 0);
  }
LAB_002fb6fa:
  if (overlay_text != (char *)0x0) {
    local_110.y = local_c8.Min.y + (local_148->Style).FramePadding.y;
    local_110.x = local_c8.Min.x;
    local_160 = (ImVec2)vmovlps_avx(SUB6416(ZEXT464(0x3f000000),0));
    RenderTextClipped(&local_110,&local_c8.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_160,
                      (ImRect *)0x0);
  }
  if (0.0 < (float)local_88._0_4_) {
    auVar17._4_12_ = local_108._4_12_;
    auVar17._0_4_ = local_c8.Max.x + (local_148->Style).ItemInnerSpacing.x;
    RenderText(auVar17._0_8_,text,(char *)0x0,true);
  }
  return (int)local_168;
}

Assistant:

int ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 frame_size)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return -1;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (frame_size.x == 0.0f)
        frame_size.x = CalcItemWidth();
    if (frame_size.y == 0.0f)
        frame_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return -1;
    const bool hovered = ItemHoverable(frame_bb, id);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            if (v != v) // Ignore NaN values
                continue;
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const int values_count_min = (plot_type == ImGuiPlotType_Lines) ? 2 : 1;
    int idx_hovered = -1;
    if (values_count >= values_count_min)
    {
        int res_w = ImMin((int)frame_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        if (hovered && inner_bb.Contains(g.IO.MousePos))
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx + 1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            idx_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (1 + scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f, 0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);

    // Return hovered index or -1 if none are hovered.
    // This is currently not exposed in the public API because we need a larger redesign of the whole thing, but in the short-term we are making it available in PlotEx().
    return idx_hovered;
}